

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crop.cpp
# Opt level: O2

int __thiscall ncnn::Crop::load_param(Crop *this,ParamDict *pd)

{
  int iVar1;
  bool bVar2;
  Mat MStack_a8;
  Mat local_68;
  
  iVar1 = ParamDict::get(pd,0,0);
  this->woffset = iVar1;
  iVar1 = ParamDict::get(pd,1,0);
  this->hoffset = iVar1;
  iVar1 = ParamDict::get(pd,2,0);
  this->coffset = iVar1;
  iVar1 = ParamDict::get(pd,3,0);
  this->outw = iVar1;
  iVar1 = ParamDict::get(pd,4,0);
  this->outh = iVar1;
  iVar1 = ParamDict::get(pd,5,0);
  this->outc = iVar1;
  iVar1 = ParamDict::get(pd,6,0);
  this->woffset2 = iVar1;
  iVar1 = ParamDict::get(pd,7,0);
  this->hoffset2 = iVar1;
  iVar1 = ParamDict::get(pd,8,0);
  this->coffset2 = iVar1;
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.c = 0;
  local_68.cstep = 0;
  ParamDict::get(&MStack_a8,pd,9,&local_68);
  Mat::operator=(&this->starts,&MStack_a8);
  Mat::~Mat(&MStack_a8);
  Mat::~Mat(&local_68);
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.c = 0;
  local_68.cstep = 0;
  ParamDict::get(&MStack_a8,pd,10,&local_68);
  Mat::operator=(&this->ends,&MStack_a8);
  Mat::~Mat(&MStack_a8);
  Mat::~Mat(&local_68);
  local_68.elemsize._0_4_ = 0;
  local_68._20_8_ = 0;
  local_68.data = (void *)0x0;
  local_68.refcount._0_4_ = 0;
  local_68.refcount._4_4_ = 0;
  local_68.allocator = (Allocator *)0x0;
  local_68.dims = 0;
  local_68.w = 0;
  local_68.h = 0;
  local_68.c = 0;
  local_68.cstep = 0;
  ParamDict::get(&MStack_a8,pd,0xb,&local_68);
  Mat::operator=(&this->axes,&MStack_a8);
  Mat::~Mat(&MStack_a8);
  Mat::~Mat(&local_68);
  if ((this->starts).data == (void *)0x0) {
    bVar2 = false;
  }
  else {
    bVar2 = false;
    if (((long)(this->starts).c * (this->starts).cstep != 0) && ((this->ends).data != (void *)0x0))
    {
      bVar2 = (long)(this->ends).c * (this->ends).cstep != 0;
    }
  }
  if ((((!bVar2) && (this->outw == 0)) && (this->outh == 0)) && (this->outc == 0)) {
    (this->super_Layer).one_blob_only = false;
  }
  return 0;
}

Assistant:

int Crop::load_param(const ParamDict& pd)
{
    woffset = pd.get(0, 0);
    hoffset = pd.get(1, 0);
    coffset = pd.get(2, 0);
    outw = pd.get(3, 0);
    outh = pd.get(4, 0);
    outc = pd.get(5, 0);
    woffset2 = pd.get(6, 0);
    hoffset2 = pd.get(7, 0);
    coffset2 = pd.get(8, 0);

    starts = pd.get(9, Mat());
    ends = pd.get(10, Mat());
    axes = pd.get(11, Mat());

    bool numpy_style_slice = !starts.empty() && !ends.empty();

    if (outw == 0 && outh == 0 && outc == 0 && !numpy_style_slice)
    {
        one_blob_only = false;
    }

    return 0;
}